

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::unpack_bc4(void *pBlock_bits,uint8_t *pPixels,uint32_t stride)

{
  uint6 uVar1;
  byte bVar2;
  long lVar3;
  uint8_t sel_values [8];
  
  bc4_block::get_block_values(sel_values,(uint)*pBlock_bits,(uint)*(byte *)((long)pBlock_bits + 1));
  uVar1 = *(uint6 *)((long)pBlock_bits + 2);
  for (lVar3 = 9; lVar3 != 0x39; lVar3 = lVar3 + 0xc) {
    bVar2 = (byte)lVar3;
    *pPixels = sel_values[(uint)(uVar1 >> (bVar2 - 9 & 0x3f)) & 7];
    pPixels[stride] = sel_values[(uint)(uVar1 >> (bVar2 - 6 & 0x3f)) & 7];
    pPixels[stride * 2] = sel_values[(uint)(uVar1 >> (bVar2 - 3 & 0x3f)) & 7];
    pPixels[stride * 3] = sel_values[(uint)(uVar1 >> (bVar2 & 0x3f)) & 7];
    pPixels = pPixels + (stride << 2);
  }
  return;
}

Assistant:

void unpack_bc4(const void* pBlock_bits, uint8_t* pPixels, uint32_t stride)
	{
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc4_block* pBlock = static_cast<const bc4_block*>(pBlock_bits);

		uint8_t sel_values[8];
		bc4_block::get_block_values(sel_values, pBlock->get_low_alpha(), pBlock->get_high_alpha());

		const uint64_t selector_bits = pBlock->get_selector_bits();

		for (uint32_t y = 0; y < 4; y++, pPixels += (stride * 4U))
		{
			pPixels[0] = sel_values[pBlock->get_selector(0, y, selector_bits)];
			pPixels[stride * 1] = sel_values[pBlock->get_selector(1, y, selector_bits)];
			pPixels[stride * 2] = sel_values[pBlock->get_selector(2, y, selector_bits)];
			pPixels[stride * 3] = sel_values[pBlock->get_selector(3, y, selector_bits)];
		}
	}